

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void rtreedepth(sqlite3_context *ctx,int nArg,sqlite3_value **apArg)

{
  uint uVar1;
  sqlite3_value *pVal;
  Mem *pMem;
  int iVar2;
  ushort *puVar3;
  ulong val;
  
  pVal = *apArg;
  uVar1._0_2_ = pVal->flags;
  uVar1._2_1_ = pVal->enc;
  uVar1._3_1_ = pVal->eSubtype;
  if ((0x1000000010001U >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
    iVar2 = sqlite3ValueBytes(pVal,'\x01');
    if (1 < iVar2) {
      puVar3 = (ushort *)sqlite3_value_blob(*apArg);
      if (puVar3 == (ushort *)0x0) {
        sqlite3_result_error_nomem(ctx);
        return;
      }
      val = (ulong)(ushort)(*puVar3 << 8 | *puVar3 >> 8);
      pMem = ctx->pOut;
      if ((pMem->flags & 0x9000) != 0) {
        vdbeReleaseAndSetInt64(pMem,val);
        return;
      }
      (pMem->u).i = val;
      pMem->flags = 4;
      return;
    }
  }
  ctx->isError = 1;
  sqlite3VdbeMemSetStr
            (ctx->pOut,"Invalid argument to rtreedepth()",-1,'\x01',
             (_func_void_void_ptr *)0xffffffffffffffff);
  return;
}

Assistant:

static void rtreedepth(sqlite3_context *ctx, int nArg, sqlite3_value **apArg){
  UNUSED_PARAMETER(nArg);
  if( sqlite3_value_type(apArg[0])!=SQLITE_BLOB
   || sqlite3_value_bytes(apArg[0])<2

  ){
    sqlite3_result_error(ctx, "Invalid argument to rtreedepth()", -1);
  }else{
    u8 *zBlob = (u8 *)sqlite3_value_blob(apArg[0]);
    if( zBlob ){
      sqlite3_result_int(ctx, readInt16(zBlob));
    }else{
      sqlite3_result_error_nomem(ctx);
    }
  }
}